

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O1

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Unarchive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
            *this,MemIOReader *Reader)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint unaff_R12D;
  bool bVar7;
  byte bVar8;
  value_type tmp_item;
  DeltaEntry local_40;
  
  uVar4 = (ulong)Reader->m_capacity;
  uVar6 = (ulong)Reader->m_size;
  uVar1 = uVar6 + 4;
  if (uVar1 <= uVar4) {
    uVar5 = *(uint *)(Reader->m_p + uVar6);
    unaff_R12D = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = Reader->m_size + 4;
    uVar6 = (ulong)uVar5;
    Reader->m_size = uVar5;
  }
  bVar8 = (byte)uVar6;
  if (uVar4 < uVar1) {
    bVar3 = false;
  }
  else {
    uVar5 = Reader->m_size;
    uVar1 = (ulong)uVar5 + 4;
    if (uVar1 <= uVar4) {
      iVar2 = *(int *)(Reader->m_p + uVar5);
      Reader->m_size = uVar5 + 4;
      bVar8 = iVar2 == 0x6000000;
    }
    bVar3 = false;
    if ((uVar1 <= uVar4) && (unaff_R12D == 0 || (bVar8 & 1) != 0)) {
      if (unaff_R12D == 0) {
        bVar3 = true;
      }
      else {
        uVar5 = 1;
        do {
          local_40.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00224a98;
          local_40.PosTableIndex = '\0';
          local_40.Slice = '\0';
          local_40.ElementData = 0;
          bVar3 = IndexTableSegment::DeltaEntry::Unarchive(&local_40,Reader);
          if (bVar3) {
            std::
            vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
            ::push_back(&this->
                         super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                        ,&local_40);
          }
          bVar7 = uVar5 < unaff_R12D;
          uVar5 = uVar5 + 1;
        } while (bVar3 && bVar7);
      }
    }
  }
  return bVar3;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }